

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::container_internal::
     Deallocate<8ul,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>>
               (allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_> *alloc,void *p,
               size_t n)

{
  allocator<absl::container_internal::Deallocate<8ul,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>>(std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>*,void*,unsigned_long)::M>
  local_21;
  size_t sStack_20;
  A mem_alloc;
  size_t n_local;
  void *p_local;
  allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_> *alloc_local;
  
  sStack_20 = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/container_memory.h"
                  ,0x41,
                  "void absl::container_internal::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>]"
                 );
  }
  std::
  allocator<absl::container_internal::Deallocate<8ul,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>>(std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>*,void*,unsigned_long)::M>
  ::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>(&local_21,alloc);
  allocator_traits<std::allocator<M>_>::deallocate
            ((allocator<M> *)&local_21,(pointer)p,sStack_20 + 7 >> 3);
  std::allocator<M>::~allocator((allocator<M> *)&local_21);
  return;
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}